

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void prepdomain(rnndb *db,rnndomain *dom)

{
  char *pcVar1;
  char *local_38;
  int local_1c;
  int i;
  rnndomain *dom_local;
  rnndb *db_local;
  
  prepvarinfo(db,dom->name,&dom->varinfo,(rnnvarinfo *)0x0);
  for (local_1c = 0; local_1c < dom->subelemsnum; local_1c = local_1c + 1) {
    if (dom->bare == 0) {
      local_38 = dom->name;
    }
    else {
      local_38 = (char *)0x0;
    }
    prepdelem(db,dom->subelems[local_1c],local_38,&dom->varinfo,dom->width);
  }
  pcVar1 = catstr((dom->varinfo).prefix,dom->name);
  dom->fullname = pcVar1;
  return;
}

Assistant:

static void prepdomain(struct rnndb *db, struct rnndomain *dom) {
	prepvarinfo (db, dom->name, &dom->varinfo, 0);
	int i;
	for (i = 0; i < dom->subelemsnum; i++)
		prepdelem(db, dom->subelems[i], dom->bare?0:dom->name, &dom->varinfo, dom->width);
	dom->fullname = catstr(dom->varinfo.prefix, dom->name);
}